

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeRecordUnpack(KeyInfo *pKeyInfo,int nKey,void *pKey,UnpackedRecord *p)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  u32 uVar4;
  uint uVar5;
  uint uVar6;
  u16 uVar7;
  Mem *pMem;
  u32 serial_type;
  u32 szHdr;
  u32 local_44;
  uint local_40;
  uint local_3c;
  UnpackedRecord *local_38;
  
  pMem = p->aMem;
  p->default_rc = '\0';
  local_38 = p;
  if (*pKey < '\0') {
    bVar2 = sqlite3GetVarint32((uchar *)pKey,&local_40);
    uVar6 = (uint)bVar2;
  }
  else {
    uVar6 = 1;
    local_40 = (int)*pKey;
  }
  uVar7 = 0;
  local_3c = local_40;
  uVar5 = local_40;
  do {
    if ((local_3c <= uVar6) || ((uint)nKey < uVar5)) break;
    cVar1 = *(char *)((long)pKey + (ulong)uVar6);
    if (cVar1 < '\0') {
      bVar2 = sqlite3GetVarint32((uchar *)((ulong)uVar6 + (long)pKey),&local_44);
      uVar3 = (uint)bVar2;
    }
    else {
      uVar3 = 1;
      local_44 = (int)cVar1;
    }
    uVar6 = uVar6 + uVar3;
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    pMem->szMalloc = 0;
    pMem->z = (char *)0x0;
    uVar4 = sqlite3VdbeSerialGet((uchar *)((ulong)uVar5 + (long)pKey),local_44,pMem);
    uVar5 = uVar5 + uVar4;
    pMem = pMem + 1;
    uVar7 = uVar7 + 1;
  } while (uVar7 < local_38->nField);
  if (uVar7 != 0 && (uint)nKey < uVar5) {
    if ((pMem[-1].flags & 0x2400) == 0) {
      pMem[-1].flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem + -1);
    }
  }
  local_38->nField = uVar7;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeRecordUnpack(
  KeyInfo *pKeyInfo,     /* Information about the record format */
  int nKey,              /* Size of the binary record */
  const void *pKey,      /* The binary record */
  UnpackedRecord *p      /* Populate this structure before returning. */
){
  const unsigned char *aKey = (const unsigned char *)pKey;
  u32 d; 
  u32 idx;                        /* Offset in aKey[] to read from */
  u16 u;                          /* Unsigned loop counter */
  u32 szHdr;
  Mem *pMem = p->aMem;

  p->default_rc = 0;
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  idx = getVarint32(aKey, szHdr);
  d = szHdr;
  u = 0;
  while( idx<szHdr && d<=(u32)nKey ){
    u32 serial_type;

    idx += getVarint32(&aKey[idx], serial_type);
    pMem->enc = pKeyInfo->enc;
    pMem->db = pKeyInfo->db;
    /* pMem->flags = 0; // sqlite3VdbeSerialGet() will set this for us */
    pMem->szMalloc = 0;
    pMem->z = 0;
    d += sqlite3VdbeSerialGet(&aKey[d], serial_type, pMem);
    pMem++;
    if( (++u)>=p->nField ) break;
  }
  if( d>(u32)nKey && u ){
    assert( CORRUPT_DB );
    /* In a corrupt record entry, the last pMem might have been set up using 
    ** uninitialized memory. Overwrite its value with NULL, to prevent
    ** warnings from MSAN. */
    sqlite3VdbeMemSetNull(pMem-1);
  }
  assert( u<=pKeyInfo->nKeyField + 1 );
  p->nField = u;
}